

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
::next_raw(optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
          *this,bool all_cofacets)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_> *pBVar4;
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
  *this_00;
  bool bVar5;
  char cVar6;
  logic_error *this_01;
  int iVar7;
  coefficient_t coefficient;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  simplex_t sVar12;
  int iVar13;
  ulong uVar14;
  int *piVar15;
  char cVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  float diameter;
  float fVar20;
  diameter_entry_t dVar21;
  
  bVar5 = has_next(this,all_cofacets);
  if (!bVar5) {
    bVar5 = false;
LAB_0012f218:
    (__return_storage_ptr__->
    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
    )._M_payload.
    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
    ._M_engaged = bVar5;
    return __return_storage_ptr__;
  }
  pBVar4 = this->simplex_encoding;
  iVar3 = this->j;
  bVar2 = this->k;
  uVar9 = this->idx_below;
  sVar12 = this->idx_above;
  lVar8 = (long)iVar3 << 0x20;
  cVar16 = bVar2 + 1;
  lVar18 = 0;
  do {
    lVar1 = iVar3 + lVar18;
    cVar6 = (char)((ulong)bVar2 + lVar18);
    iVar17 = (int)lVar18;
    if (cVar6 == '\0') {
      if (uVar9 == 0) {
        uVar9 = 0;
        goto LAB_0012f14c;
      }
      uVar19 = uVar9 - 1;
      this->idx_below = uVar19;
LAB_0012f0d7:
      lVar11 = lVar1 << (cVar6 * (char)pBVar4->bits_per_vertex & 0x3fU);
      uVar9 = uVar19;
    }
    else {
      uVar14 = lVar1 << ((bVar2 + (char)lVar18 + -1) * (char)pBVar4->bits_per_vertex & 0x3f);
      uVar19 = uVar9 - uVar14;
      if (uVar9 < uVar14) {
LAB_0012f14c:
        iVar7 = iVar3 + iVar17;
        diameter = (this->simplex).
                   super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
                   .first;
        for (piVar15 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            piVar15 !=
            (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish; piVar15 = piVar15 + 1) {
          iVar10 = *piVar15;
          if (iVar3 + iVar17 == iVar10) {
            fVar20 = 0.0;
          }
          else {
            iVar13 = iVar10;
            if (iVar10 < iVar7) {
              iVar13 = iVar7;
            }
            if (iVar7 < iVar10) {
              iVar10 = iVar7;
            }
            fVar20 = (this->dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar13][iVar10];
          }
          if (fVar20 <= diameter) {
            fVar20 = diameter;
          }
          diameter = fVar20;
        }
        this->j = iVar3 + iVar17 + -1;
        if (cVar16 == '\0') {
          lVar8 = 1;
        }
        else {
          lVar8 = (lVar8 >> 0x20) << ((char)pBVar4->bits_per_vertex * cVar6 & 0x3fU);
        }
        this_00 = this->parent;
        coefficient = (~(uint)(-1L << ((byte)this_00->bits_for_coeff & 0x3f)) &
                      (uint)(this->simplex).
                            super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
                            .second.content) + 1;
        if (((ulong)bVar2 + lVar18 & 1) != 0) {
          coefficient = this_00->modulus - coefficient;
        }
        dVar21 = make_diameter_entry(this_00,diameter,sVar12 + uVar9 + lVar8,coefficient);
        (__return_storage_ptr__->
        super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
        )._M_payload.
        super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
        ._M_payload._M_value.
        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
        .first = dVar21.
                 super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
                 .first;
        *(simplex_t *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
                 ._M_payload + 8) =
             dVar21.
             super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
             .second.content.content;
        bVar5 = true;
        goto LAB_0012f218;
      }
      this->idx_below = uVar19;
      lVar11 = 1;
      uVar9 = uVar19;
      if (cVar16 != '\0') goto LAB_0012f0d7;
    }
    sVar12 = sVar12 + lVar11;
    this->idx_above = sVar12;
    this->j = iVar17 + iVar3 + -1;
    this->k = bVar2 + (char)lVar18 + -1;
    lVar18 = lVar18 + -1;
    lVar8 = lVar8 + -0x100000000;
    cVar16 = cVar16 + -1;
    if (cVar16 == '\0') {
      this_01 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_01,"");
      __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  } while( true );
}

Assistant:

std::optional<diameter_entry_t> next_raw(bool all_cofacets = true) {
      if (!has_next(all_cofacets)) return std::nullopt;
      // this requires simplex_encoding(x,0)>0
      while (simplex_encoding(j, k) <= idx_below) {
        idx_below -= simplex_encoding(j, k);
        idx_above += simplex_encoding(j, k + 1);
        --j;
        --k;
        GUDHI_assert(k != -1);
      }
      value_t cofacet_diameter = get_diameter(simplex);
      // The order of j and i matters for performance
      for (vertex_t i : vertices) cofacet_diameter = std::max(cofacet_diameter, dist(j, i));
      simplex_t cofacet_index = idx_above + simplex_encoding(j--, k + 1) + idx_below;
      coefficient_t cofacet_coefficient = parent.get_coefficient(simplex);
      if (k & 1) cofacet_coefficient = parent.modulus - cofacet_coefficient;
      return parent.make_diameter_entry(cofacet_diameter, cofacet_index, cofacet_coefficient);
    }